

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O2

void __thiscall board::Board::updateListMaterial(Board *this)

{
  int iVar1;
  long lVar2;
  uint64_t *bb;
  int *piVar3;
  int i;
  long lVar4;
  
  piVar3 = SQ64;
  for (lVar4 = 0; lVar4 != 0x78; lVar4 = lVar4 + 1) {
    iVar1 = this->board[lVar4];
    lVar2 = (long)iVar1;
    if ((lVar2 != 0) && (iVar1 != 99)) {
      this->pList[lVar2][this->pNum[lVar2]] = (int)lVar4;
      this->pNum[lVar2] = this->pNum[lVar2] + 1;
      this->material[PIECE_COLOR[lVar2]] = this->material[PIECE_COLOR[lVar2]] + PIECE_VAL[lVar2];
      bb = this->pawns;
      if ((iVar1 == 1) || (bb = this->pawns + 1, iVar1 == 7)) {
        iVar1 = *piVar3;
        bitboard::setBit(bb,iVar1);
        bitboard::setBit(this->pawns + 2,iVar1);
      }
    }
    piVar3 = piVar3 + 1;
  }
  return;
}

Assistant:

void board::Board::updateListMaterial()
{
    int piece;
    for (int i = 0; i < 120; i++) {
        piece = board[i];
        if (piece != NO_SQ && piece != EMPTY) {
            pList[piece][pNum[piece]] = i;
            pNum[piece]++;
            material[PIECE_COLOR[piece]] += PIECE_VAL[piece];
            if (piece == WP) {
                board::bitboard::setBit(pawns[WHITE], SQ64[i]);
                board::bitboard::setBit(pawns[BOTH], SQ64[i]);
            }
            else if (piece == BP) {
                board::bitboard::setBit(pawns[BLACK], SQ64[i]);
                board::bitboard::setBit(pawns[BOTH], SQ64[i]);
            }
        }
    }
}